

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Packet.cpp
# Opt level: O1

Packet * __thiscall mognetwork::Packet::operator>>(Packet *this,string *data)

{
  vector<char,_std::allocator<char>_> *pvVar1;
  pointer pcVar2;
  ulong uVar3;
  void *__dest;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar4 = this->m_readerPos + 4;
  pvVar1 = this->m_data;
  pcVar2 = (pvVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  uVar3 = (long)(pvVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pcVar2;
  uVar5 = 0;
  if (uVar4 <= uVar3) {
    uVar5 = *(uint *)(pcVar2 + this->m_readerPos);
    this->m_readerPos = uVar4;
  }
  if (0 < (int)uVar5) {
    uVar4 = this->m_readerPos;
    uVar6 = uVar4 + uVar5;
    if (uVar6 <= uVar3) {
      __dest = operator_new__((ulong)(uVar5 + 1));
      memcpy(__dest,(pvVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_start + uVar4,(ulong)uVar5);
      *(undefined1 *)((long)__dest + (ulong)uVar5) = 0;
      this->m_readerPos = uVar6;
      std::__cxx11::string::append((char *)data);
      operator_delete(__dest);
    }
  }
  return this;
}

Assistant:

Packet& Packet::operator>>(std::string& data)
  {
    int32_t size = 0;
    *this >> size;

    if (size > 0 && verifySize(size))
      {
	char *buffer = new char[size + 1];
	memcpy(buffer, &((*m_data)[m_readerPos]), size);
	buffer[size] = '\0';
	m_readerPos += size;
	data.append(buffer);
	delete buffer;
      }
    return (*this);
  }